

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O3

void secp256k1_scalar_verify(secp256k1_scalar *r)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint uVar5;
  undefined4 extraout_EAX;
  int iVar6;
  secp256k1_gej *psVar7;
  int64_t iVar8;
  int64_t iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint64_t *puVar13;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  ulong extraout_RAX_07;
  long lVar14;
  byte bVar15;
  undefined4 uVar16;
  int iVar17;
  uint uVar18;
  secp256k1_modinv64_signed62 *psVar19;
  secp256k1_modinv64_signed62 *psVar20;
  ulong *extraout_RDX;
  long lVar21;
  long lVar22;
  secp256k1_gej *psVar23;
  secp256k1_gej *psVar24;
  long extraout_RDX_00;
  long extraout_RDX_01;
  long extraout_RDX_02;
  long extraout_RDX_03;
  long extraout_RDX_04;
  long extraout_RDX_05;
  long extraout_RDX_06;
  long extraout_RDX_07;
  long extraout_RDX_08;
  secp256k1_modinv64_signed62 *a;
  long *extraout_RDX_09;
  long lVar25;
  secp256k1_modinv64_signed62 *b;
  secp256k1_gej *psVar26;
  secp256k1_gej *psVar27;
  uint uVar28;
  secp256k1_gej *psVar29;
  long lVar30;
  secp256k1_fe *a_00;
  secp256k1_gej *a_01;
  secp256k1_gej *psVar31;
  secp256k1_gej *psVar32;
  secp256k1_gej *psVar33;
  secp256k1_gej *psVar34;
  secp256k1_gej *psVar35;
  secp256k1_gej *psVar36;
  secp256k1_gej *psVar37;
  ulong uVar38;
  long lVar39;
  ulong uVar40;
  ulong uVar41;
  long lVar42;
  secp256k1_modinv64_signed62 *psVar43;
  bool bVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  secp256k1_modinv64_signed62 sStack_328;
  secp256k1_modinv64_signed62 sStack_300;
  secp256k1_gej *psStack_2d8;
  secp256k1_gej *psStack_2d0;
  secp256k1_modinv64_signed62 *psStack_2c8;
  ulong uStack_2c0;
  secp256k1_gej *psStack_2b8;
  ulong uStack_2b0;
  secp256k1_gej *psStack_2a8;
  secp256k1_modinv64_signed62 *psStack_2a0;
  secp256k1_gej *psStack_298;
  uint64_t uStack_290;
  uint64_t uStack_288;
  secp256k1_gej *psStack_280;
  uint64_t uStack_278;
  uint64_t uStack_270;
  uint64_t uStack_268;
  uint64_t uStack_260;
  uint64_t uStack_258;
  secp256k1_gej *psStack_250;
  secp256k1_gej *psStack_248;
  secp256k1_gej *psStack_240;
  secp256k1_gej *psStack_238;
  secp256k1_gej *psStack_230;
  long lStack_228;
  secp256k1_gej *psStack_220;
  code *pcStack_218;
  uint uStack_20c;
  ulong uStack_208;
  secp256k1_gej *apsStack_200 [2];
  undefined1 auStack_1f0 [56];
  uint64_t auStack_1b8 [5];
  secp256k1_modinv64_trans2x2 sStack_190;
  undefined1 auStack_170 [96];
  secp256k1_gej *psStack_110;
  ulong uStack_108;
  secp256k1_gej *psStack_100;
  ulong uStack_f8;
  secp256k1_gej *psStack_f0;
  secp256k1_gej *psStack_e0;
  secp256k1_gej *psStack_d8;
  secp256k1_gej *psStack_c8;
  secp256k1_fe *psStack_c0;
  secp256k1_fe sStack_b8;
  secp256k1_fe *psStack_88;
  secp256k1_gej *psStack_80;
  code *pcStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  ulong uStack_60;
  secp256k1_gej *psStack_58;
  ulong uStack_50;
  ulong uStack_48;
  secp256k1_gej *psStack_40;
  secp256k1_scalar *r_00;
  
  bVar44 = r->d[3] == 0xffffffffffffffff;
  uVar18 = (uint)((0xfffffffffffffffd < r->d[2] && bVar44) && 0xbaaedce6af48a03a < r->d[1]);
  uVar28 = 0;
  if (0xbaaedce6af48a03b < r->d[1]) {
    uVar28 = uVar18;
  }
  uVar28 = uVar28 | (r->d[2] == 0xffffffffffffffff && bVar44);
  r_00 = (secp256k1_scalar *)(ulong)uVar28;
  uVar5 = 0;
  if (0xbfd25e8cd0364140 < r->d[0]) {
    uVar5 = uVar18;
  }
  if (uVar5 == 0 && uVar28 == 0) {
    return;
  }
  secp256k1_scalar_verify_cold_1();
  pcStack_78 = (code *)0x148e98;
  secp256k1_scalar_verify(r_00);
  uStack_70 = r_00->d[2] | r_00->d[0];
  uStack_68 = r_00->d[3] | r_00->d[1];
  pcStack_78 = (code *)0x148eb0;
  secp256k1_scalar_verify(r_00);
  uVar38 = r_00->d[0];
  uVar10 = r_00->d[1];
  uVar11 = r_00->d[2];
  uVar12 = r_00->d[3];
  pcStack_78 = (code *)0x148ec7;
  secp256k1_scalar_verify(r_00);
  uVar16 = 0xffffffff;
  uVar41 = uVar38 & 0x3fffffffffffffff;
  psVar37 = (secp256k1_gej *)((uVar10 & 0xfffffffffffffff) << 2 | uVar38 >> 0x3e);
  uVar38 = (uVar11 & 0x3ffffffffffffff) << 4 | uVar10 >> 0x3c;
  uStack_48 = (uVar12 & 0xffffffffffffff) << 6 | uVar11 >> 0x3a;
  psVar27 = (secp256k1_gej *)(uVar12 >> 0x38);
  pcStack_78 = (code *)0x148f1a;
  uStack_60 = uVar41;
  psStack_58 = psVar37;
  uStack_50 = uVar38;
  psStack_40 = psVar27;
  secp256k1_modinv64_var
            ((secp256k1_modinv64_signed62 *)&stack0xffffffffffffffa0,&secp256k1_const_modinfo_scalar
            );
  pcStack_78 = (code *)0x148f25;
  psVar26 = (secp256k1_gej *)&stack0xffffffffffffffa0;
  secp256k1_scalar_from_signed62(r,(secp256k1_modinv64_signed62 *)&stack0xffffffffffffffa0);
  pcStack_78 = (code *)0x148f2d;
  secp256k1_scalar_verify(r);
  pcStack_78 = (code *)0x148f35;
  a_00 = (secp256k1_fe *)r;
  secp256k1_scalar_verify(r);
  auVar45._0_4_ =
       -(uint)((int)((secp256k1_fe *)r)->n[2] == 0 && (int)((secp256k1_fe *)r)->n[0] == 0);
  auVar45._4_4_ =
       -(uint)(*(int *)((long)((secp256k1_fe *)r)->n + 0x14) == 0 &&
              *(int *)((long)((secp256k1_fe *)r)->n + 4) == 0);
  auVar45._8_4_ =
       -(uint)((int)((secp256k1_fe *)r)->n[3] == 0 && (int)((secp256k1_fe *)r)->n[1] == 0);
  auVar45._12_4_ =
       -(uint)(*(int *)((long)((secp256k1_fe *)r)->n + 0x1c) == 0 &&
              *(int *)((long)((secp256k1_fe *)r)->n + 0xc) == 0);
  iVar6 = movmskps(extraout_EAX,auVar45);
  auVar46._0_4_ = -(uint)((int)uStack_70 == 0);
  auVar46._4_4_ = -(uint)(uStack_70._4_4_ == 0);
  auVar46._8_4_ = -(uint)((int)uStack_68 == 0);
  auVar46._12_4_ = -(uint)(uStack_68._4_4_ == 0);
  iVar17 = movmskps(uVar16,auVar46);
  if ((iVar17 != 0xf) != (iVar6 == 0xf)) {
    return;
  }
  pcStack_78 = secp256k1_gej_eq_x_var;
  secp256k1_scalar_inverse_var_cold_1();
  psStack_c0 = (secp256k1_fe *)0x148f91;
  psVar33 = psVar26;
  psStack_88 = (secp256k1_fe *)r;
  psStack_80 = (secp256k1_gej *)&stack0xffffffffffffffa0;
  pcStack_78 = (code *)uVar41;
  secp256k1_fe_verify(a_00);
  psStack_c0 = (secp256k1_fe *)0x148f99;
  psVar23 = psVar26;
  secp256k1_gej_verify(psVar26);
  if (psVar26->infinity == 0) {
    psStack_c0 = (secp256k1_fe *)0x148fb1;
    secp256k1_fe_sqr(&sStack_b8,&psVar26->z);
    psStack_c0 = (secp256k1_fe *)0x148fbf;
    secp256k1_fe_mul(&sStack_b8,&sStack_b8,a_00);
    psStack_c0 = (secp256k1_fe *)0x148fca;
    secp256k1_fe_equal(&sStack_b8,&psVar26->x);
    return;
  }
  psStack_c0 = (secp256k1_fe *)secp256k1_fe_cmp_var;
  secp256k1_gej_eq_x_var_cold_1();
  psStack_d8 = (secp256k1_gej *)0x148fe8;
  psVar29 = psVar33;
  psStack_c8 = psVar26;
  psStack_c0 = a_00;
  secp256k1_fe_verify(&psVar23->x);
  psStack_d8 = (secp256k1_gej *)0x148ff0;
  psVar26 = psVar33;
  secp256k1_fe_verify(&psVar33->x);
  if ((psVar23->x).normalized == 0) {
    psStack_d8 = (secp256k1_gej *)0x149032;
    secp256k1_fe_cmp_var_cold_2();
  }
  else if ((psVar33->x).normalized != 0) {
    uVar28 = 4;
    while( true ) {
      uVar38 = (psVar33->x).n[uVar28];
      uVar10 = (psVar23->x).n[uVar28];
      if (uVar10 >= uVar38 && uVar10 != uVar38) {
        return;
      }
      if (uVar10 < uVar38) break;
      bVar44 = uVar28 == 0;
      uVar28 = uVar28 - 1;
      if (bVar44) {
        return;
      }
    }
    return;
  }
  psStack_d8 = (secp256k1_gej *)secp256k1_fe_add;
  secp256k1_fe_cmp_var_cold_1();
  psStack_f0 = (secp256k1_gej *)0x149046;
  psVar34 = psVar29;
  psStack_e0 = psVar33;
  psStack_d8 = psVar23;
  secp256k1_fe_verify(&psVar26->x);
  psStack_f0 = (secp256k1_gej *)0x14904e;
  psVar33 = psVar29;
  secp256k1_fe_verify(&psVar29->x);
  iVar6 = (psVar29->x).magnitude + (psVar26->x).magnitude;
  if (iVar6 < 0x21) {
    (psVar26->x).n[0] = (psVar26->x).n[0] + (psVar29->x).n[0];
    puVar13 = (psVar26->x).n + 1;
    *puVar13 = *puVar13 + (psVar29->x).n[1];
    puVar13 = (psVar26->x).n + 2;
    *puVar13 = *puVar13 + (psVar29->x).n[2];
    puVar13 = (psVar26->x).n + 3;
    *puVar13 = *puVar13 + (psVar29->x).n[3];
    puVar13 = (psVar26->x).n + 4;
    *puVar13 = *puVar13 + (psVar29->x).n[4];
    (psVar26->x).magnitude = iVar6;
    (psVar26->x).normalized = 0;
    secp256k1_fe_verify(&psVar26->x);
    return;
  }
  psStack_f0 = (secp256k1_gej *)secp256k1_modinv64_var;
  secp256k1_fe_add_cold_1();
  psStack_f0 = psVar27;
  uStack_f8 = uVar41;
  psStack_100 = psVar29;
  uStack_108 = uVar38;
  psStack_110 = psVar37;
  auStack_170._88_8_ = psVar26;
  auStack_170._16_8_ = 0;
  auStack_170._24_8_ = 0;
  auStack_170._0_8_ = 0;
  auStack_170._8_8_ = 0;
  auStack_170._32_8_ = 0;
  auStack_170._72_8_ = 0;
  auStack_170._80_8_ = 0;
  auStack_170._56_8_ = 0;
  auStack_170._64_8_ = 0;
  auStack_170._48_8_ = 1;
  auStack_1f0._32_8_ = (psVar34->x).n[4];
  apsStack_200[1] = psVar34;
  auStack_1f0._16_8_ = (psVar34->x).n[2];
  auStack_1f0._24_8_ = (psVar34->x).n[3];
  auStack_1f0._0_8_ = (secp256k1_gej *)(psVar34->x).n[0];
  auStack_1f0._8_8_ = (psVar34->x).n[1];
  auStack_1b8[3] = (psVar33->x).n[4];
  auStack_1f0._48_8_ = (psVar33->x).n[0];
  auStack_1b8[0] = (psVar33->x).n[1];
  apsStack_200[0] = psVar33;
  auStack_1b8[1] = (psVar33->x).n[2];
  auStack_1b8[2] = (psVar33->x).n[3];
  uStack_208 = 0;
  lVar42 = -1;
  uStack_20c = 5;
LAB_00149138:
  psVar33 = (secp256k1_gej *)auStack_1f0._0_8_;
  psVar34 = apsStack_200[1];
  psVar7 = (secp256k1_gej *)0x0;
  psVar24 = (secp256k1_gej *)0x0;
  psVar32 = (secp256k1_gej *)0x1;
  uVar28 = 0x3e;
  psVar29 = (secp256k1_gej *)0x1;
  uVar38 = auStack_1f0._48_8_;
  psVar23 = (secp256k1_gej *)auStack_1f0._0_8_;
  while( true ) {
    a_01 = (secp256k1_gej *)(-1L << ((byte)uVar28 & 0x3f) | uVar38);
    psVar19 = (secp256k1_modinv64_signed62 *)0x0;
    if (a_01 != (secp256k1_gej *)0x0) {
      for (; ((ulong)a_01 >> (long)psVar19 & 1) == 0;
          psVar19 = (secp256k1_modinv64_signed62 *)((long)psVar19->v + 1)) {
      }
    }
    bVar15 = (byte)psVar19;
    psVar35 = (secp256k1_gej *)(uVar38 >> (bVar15 & 0x3f));
    psVar29 = (secp256k1_gej *)((long)psVar29 << (bVar15 & 0x3f));
    psVar7 = (secp256k1_gej *)((long)psVar7 << (bVar15 & 0x3f));
    lVar42 = lVar42 - (long)psVar19;
    uVar28 = uVar28 - (int)psVar19;
    if (uVar28 == 0) break;
    if (((ulong)psVar23 & 1) == 0) {
      pcStack_218 = (code *)0x1495b5;
      secp256k1_modinv64_var_cold_8();
LAB_001495b5:
      pcStack_218 = (code *)0x1495ba;
      secp256k1_modinv64_var_cold_7();
LAB_001495ba:
      pcStack_218 = (code *)0x1495bf;
      secp256k1_modinv64_var_cold_1();
LAB_001495bf:
      pcStack_218 = (code *)0x1495c4;
      secp256k1_modinv64_var_cold_2();
LAB_001495c4:
      pcStack_218 = (code *)0x1495c9;
      secp256k1_modinv64_var_cold_6();
      psVar35 = psVar23;
      goto LAB_001495c9;
    }
    if (((ulong)psVar35 & 1) == 0) goto LAB_001495b5;
    a_01 = (secp256k1_gej *)((long)psVar7 * auStack_1f0._48_8_ + (long)psVar29 * auStack_1f0._0_8_);
    psVar19 = (secp256k1_modinv64_signed62 *)(ulong)(0x3e - uVar28);
    bVar15 = (byte)(0x3e - uVar28);
    psVar26 = (secp256k1_gej *)((long)psVar23 << (bVar15 & 0x3f));
    if (a_01 != psVar26) goto LAB_001495ba;
    psVar26 = (secp256k1_gej *)
              ((long)psVar32 * auStack_1f0._48_8_ + (long)psVar24 * auStack_1f0._0_8_);
    a_01 = (secp256k1_gej *)((long)psVar35 << (bVar15 & 0x3f));
    if (psVar26 != a_01) goto LAB_001495bf;
    psVar19 = (secp256k1_modinv64_signed62 *)(lVar42 - 0x2ea);
    if (psVar19 < (secp256k1_modinv64_signed62 *)0xfffffffffffffa2d) goto LAB_001495c4;
    iVar6 = (int)psVar35;
    if (lVar42 < 0) {
      lVar42 = -lVar42;
      uVar18 = (int)lVar42 + 1;
      if ((int)uVar28 <= (int)uVar18) {
        uVar18 = uVar28;
      }
      psVar19 = (secp256k1_modinv64_signed62 *)(ulong)uVar18;
      a_01 = (secp256k1_gej *)(ulong)(uVar18 - 0x3f);
      if (0xffffffc1 < uVar18 - 0x3f) {
        psVar36 = (secp256k1_gej *)-(long)psVar7;
        psVar27 = (secp256k1_gej *)-(long)psVar29;
        psVar31 = (secp256k1_gej *)-(long)psVar23;
        psVar26 = (secp256k1_gej *)
                  ((ulong)(0x3fL << (-(char)uVar18 & 0x3fU)) >> (-(char)uVar18 & 0x3fU));
        uVar18 = (iVar6 * iVar6 + 0x3e) * iVar6 * (int)psVar31 & (uint)psVar26;
        psVar7 = psVar32;
        psVar29 = psVar24;
        psVar37 = psVar36;
        goto LAB_00149294;
      }
      goto LAB_001495d3;
    }
    uVar18 = (int)lVar42 + 1;
    if ((int)uVar28 <= (int)uVar18) {
      uVar18 = uVar28;
    }
    psVar19 = (secp256k1_modinv64_signed62 *)(ulong)uVar18;
    a_01 = (secp256k1_gej *)(ulong)(uVar18 - 0x3f);
    if (uVar18 - 0x3f < 0xffffffc2) goto LAB_001495ce;
    psVar26 = (secp256k1_gej *)((ulong)(0xfL << (-(char)uVar18 & 0x3fU)) >> (-(char)uVar18 & 0x3fU))
    ;
    uVar18 = -(iVar6 * (((int)psVar23 * 2 + 2U & 8) + (int)psVar23)) & (uint)psVar26;
    psVar27 = psVar24;
    psVar36 = psVar32;
    psVar31 = psVar35;
    psVar35 = psVar23;
LAB_00149294:
    uVar10 = (ulong)uVar18;
    a_01 = (secp256k1_gej *)(uVar10 * (long)psVar35);
    uVar38 = (long)(psVar31->x).n + (long)(a_01->x).n;
    psVar24 = (secp256k1_gej *)((long)(psVar27->x).n + (long)psVar29 * uVar10);
    psVar19 = (secp256k1_modinv64_signed62 *)(uVar10 * (long)psVar7);
    psVar32 = (secp256k1_gej *)((long)psVar19->v + (long)&psVar36->x);
    psVar23 = psVar35;
    if ((uVar38 & (ulong)psVar26) != 0) {
LAB_001495c9:
      pcStack_218 = (code *)0x1495ce;
      secp256k1_modinv64_var_cold_4();
      psVar23 = psVar35;
LAB_001495ce:
      pcStack_218 = (code *)0x1495d3;
      secp256k1_modinv64_var_cold_3();
LAB_001495d3:
      pcStack_218 = (code *)0x1495d8;
      secp256k1_modinv64_var_cold_5();
      psVar34 = psVar37;
      goto LAB_001495d8;
    }
  }
  a_01 = (secp256k1_gej *)((long)psVar7 * (long)psVar24);
  psVar19 = SUB168(SEXT816((long)psVar7) * SEXT816((long)psVar24),8);
  sStack_190.u = (int64_t)psVar29;
  sStack_190.v = (int64_t)psVar7;
  sStack_190.q = (int64_t)psVar24;
  sStack_190.r = (int64_t)psVar32;
  if ((long)psVar29 * (long)psVar32 - (long)a_01 != 0x4000000000000000 ||
      SUB168(SEXT816((long)psVar29) * SEXT816((long)psVar32),8) - (long)psVar19 !=
      (ulong)((secp256k1_gej *)((long)psVar29 * (long)psVar32) < a_01)) goto LAB_0014960f;
  pcStack_218 = (code *)0x149322;
  secp256k1_modinv64_update_de_62
            ((secp256k1_modinv64_signed62 *)auStack_170,
             (secp256k1_modinv64_signed62 *)(auStack_170 + 0x30),&sStack_190,
             (secp256k1_modinv64_modinfo *)apsStack_200[1]);
  uVar28 = uStack_20c;
  psVar33 = (secp256k1_gej *)auStack_1f0;
  psVar26 = (secp256k1_gej *)(ulong)uStack_20c;
  psVar29 = (secp256k1_gej *)(ulong)uStack_20c;
  psVar19 = (secp256k1_modinv64_signed62 *)0xffffffffffffffff;
  pcStack_218 = (code *)0x14933f;
  a_01 = psVar33;
  iVar6 = secp256k1_modinv64_mul_cmp_62
                    ((secp256k1_modinv64_signed62 *)psVar33,uStack_20c,
                     (secp256k1_modinv64_signed62 *)psVar34,-1);
  psVar23 = (secp256k1_gej *)(auStack_1f0 + 0x30);
  if (0 < iVar6) {
    psVar19 = (secp256k1_modinv64_signed62 *)0x1;
    psVar29 = (secp256k1_gej *)(ulong)uVar28;
    pcStack_218 = (code *)0x14935e;
    a_01 = psVar33;
    iVar6 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar33,uVar28,
                       (secp256k1_modinv64_signed62 *)psVar34,1);
    if (0 < iVar6) goto LAB_001495dd;
    psVar29 = (secp256k1_gej *)(ulong)uVar28;
    psVar19 = (secp256k1_modinv64_signed62 *)0xffffffffffffffff;
    pcStack_218 = (code *)0x14937a;
    a_01 = psVar23;
    iVar6 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar23,uVar28,
                       (secp256k1_modinv64_signed62 *)psVar34,-1);
    if (iVar6 < 1) goto LAB_001495e2;
    psVar19 = (secp256k1_modinv64_signed62 *)0x1;
    psVar29 = (secp256k1_gej *)(ulong)uVar28;
    pcStack_218 = (code *)0x149394;
    a_01 = psVar23;
    iVar6 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar23,uVar28,
                       (secp256k1_modinv64_signed62 *)psVar34,1);
    if (-1 < iVar6) goto LAB_001495e7;
    pcStack_218 = (code *)0x1493b1;
    secp256k1_modinv64_update_fg_62_var
              (uVar28,(secp256k1_modinv64_signed62 *)psVar33,(secp256k1_modinv64_signed62 *)psVar23,
               &sStack_190);
    if (auStack_1f0._48_8_ == 0) {
      if (1 < (int)uVar28) {
        uVar38 = 1;
        uVar10 = 0;
        do {
          uVar10 = uVar10 | auStack_1b8[uVar38 - 1];
          uVar38 = uVar38 + 1;
        } while (uVar28 != uVar38);
        if (uVar10 != 0) goto LAB_001493e1;
      }
      a_01 = (secp256k1_gej *)(auStack_1f0 + 0x30);
      psVar29 = (secp256k1_gej *)(ulong)uVar28;
      psVar19 = (secp256k1_modinv64_signed62 *)0x0;
      pcStack_218 = (code *)0x1494c7;
      iVar6 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)a_01,uVar28,&SECP256K1_SIGNED62_ONE,0);
      if (iVar6 != 0) goto LAB_00149605;
      pcStack_218 = (code *)0x1494e9;
      iVar6 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)auStack_1f0,uVar28,&SECP256K1_SIGNED62_ONE,
                         -1);
      psVar33 = apsStack_200[0];
      if (iVar6 != 0) {
        pcStack_218 = (code *)0x14950a;
        iVar6 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)auStack_1f0,uVar28,&SECP256K1_SIGNED62_ONE
                           ,1);
        if (iVar6 != 0) {
          psVar29 = (secp256k1_gej *)0x5;
          psVar19 = (secp256k1_modinv64_signed62 *)0x0;
          pcStack_218 = (code *)0x149524;
          a_01 = psVar33;
          iVar6 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)psVar33,5,&SECP256K1_SIGNED62_ONE,0);
          if (iVar6 != 0) goto LAB_0014960a;
          a_01 = (secp256k1_gej *)auStack_170;
          psVar29 = (secp256k1_gej *)0x5;
          psVar19 = (secp256k1_modinv64_signed62 *)0x0;
          pcStack_218 = (code *)0x149547;
          iVar6 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)a_01,5,&SECP256K1_SIGNED62_ONE,0);
          if (iVar6 != 0) goto LAB_0014960a;
          a_01 = (secp256k1_gej *)auStack_1f0;
          psVar19 = (secp256k1_modinv64_signed62 *)0x1;
          psVar29 = (secp256k1_gej *)(ulong)uVar28;
          pcStack_218 = (code *)0x149563;
          iVar6 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)a_01,uVar28,
                             (secp256k1_modinv64_signed62 *)psVar34,1);
          if (iVar6 != 0) goto LAB_0014960a;
        }
      }
      pcStack_218 = (code *)0x149586;
      secp256k1_modinv64_normalize_62
                ((secp256k1_modinv64_signed62 *)auStack_170,
                 (int64_t)apsStack_200[(long)(int)uVar28 + 1],(secp256k1_modinv64_modinfo *)psVar34)
      ;
      (psVar33->x).n[4] = auStack_170._32_8_;
      (psVar33->x).n[2] = auStack_170._16_8_;
      (psVar33->x).n[3] = auStack_170._24_8_;
      (psVar33->x).n[0] = auStack_170._0_8_;
      (psVar33->x).n[1] = auStack_170._8_8_;
      return;
    }
LAB_001493e1:
    lVar21 = (long)(int)uVar28;
    psVar37 = apsStack_200[lVar21 + 1];
    psVar19 = (secp256k1_modinv64_signed62 *)auStack_1b8[lVar21 + -2];
    a_01 = (secp256k1_gej *)((long)psVar37 >> 0x3f ^ (ulong)psVar37 | lVar21 + -2 >> 0x3f);
    psVar29 = (secp256k1_gej *)((long)psVar19 >> 0x3f ^ (ulong)psVar19 | (ulong)a_01);
    if (psVar29 == (secp256k1_gej *)0x0) {
      psVar26 = (secp256k1_gej *)(ulong)(uVar28 - 1);
      apsStack_200[lVar21] = (secp256k1_gej *)((ulong)apsStack_200[lVar21] | (long)psVar37 << 0x3e);
      psVar19 = (secp256k1_modinv64_signed62 *)((long)psVar19 << 0x3e);
      auStack_1b8[lVar21 + -3] = auStack_1b8[lVar21 + -3] | (ulong)psVar19;
    }
    if ((int)uStack_208 == 0xb) goto LAB_001495ec;
    uVar28 = (uint)psVar26;
    psVar19 = (secp256k1_modinv64_signed62 *)0xffffffffffffffff;
    pcStack_218 = (code *)0x149445;
    psVar29 = psVar26;
    a_01 = psVar33;
    iVar6 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar33,uVar28,
                       (secp256k1_modinv64_signed62 *)psVar34,-1);
    if (iVar6 < 1) goto LAB_001495f1;
    psVar19 = (secp256k1_modinv64_signed62 *)0x1;
    pcStack_218 = (code *)0x14945f;
    psVar29 = psVar26;
    a_01 = psVar33;
    iVar6 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar33,uVar28,
                       (secp256k1_modinv64_signed62 *)psVar34,1);
    if (0 < iVar6) goto LAB_001495f6;
    psVar19 = (secp256k1_modinv64_signed62 *)0xffffffffffffffff;
    pcStack_218 = (code *)0x14947b;
    psVar29 = psVar26;
    a_01 = psVar23;
    iVar6 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar23,uVar28,
                       (secp256k1_modinv64_signed62 *)psVar34,-1);
    if (iVar6 < 1) goto LAB_001495fb;
    psVar19 = (secp256k1_modinv64_signed62 *)0x1;
    pcStack_218 = (code *)0x149495;
    psVar29 = psVar26;
    a_01 = psVar23;
    iVar6 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar23,uVar28,
                       (secp256k1_modinv64_signed62 *)psVar34,1);
    if (-1 < iVar6) goto LAB_00149600;
    uStack_208 = (ulong)((int)uStack_208 + 1);
    psVar37 = psVar34;
    uStack_20c = uVar28;
    goto LAB_00149138;
  }
LAB_001495d8:
  pcStack_218 = (code *)0x1495dd;
  secp256k1_modinv64_var_cold_20();
LAB_001495dd:
  pcStack_218 = (code *)0x1495e2;
  secp256k1_modinv64_var_cold_19();
LAB_001495e2:
  pcStack_218 = (code *)0x1495e7;
  secp256k1_modinv64_var_cold_18();
LAB_001495e7:
  pcStack_218 = (code *)0x1495ec;
  secp256k1_modinv64_var_cold_17();
LAB_001495ec:
  pcStack_218 = (code *)0x1495f1;
  secp256k1_modinv64_var_cold_14();
LAB_001495f1:
  pcStack_218 = (code *)0x1495f6;
  secp256k1_modinv64_var_cold_13();
LAB_001495f6:
  pcStack_218 = (code *)0x1495fb;
  secp256k1_modinv64_var_cold_12();
LAB_001495fb:
  pcStack_218 = (code *)0x149600;
  secp256k1_modinv64_var_cold_11();
LAB_00149600:
  pcStack_218 = (code *)0x149605;
  secp256k1_modinv64_var_cold_10();
LAB_00149605:
  pcStack_218 = (code *)0x14960a;
  secp256k1_modinv64_var_cold_15();
LAB_0014960a:
  pcStack_218 = (code *)0x14960f;
  secp256k1_modinv64_var_cold_16();
  psVar37 = psVar34;
LAB_0014960f:
  pcStack_218 = secp256k1_scalar_from_signed62;
  secp256k1_modinv64_var_cold_9();
  uVar38 = (psVar29->x).n[0];
  if (uVar38 >> 0x3e == 0) {
    uVar10 = (psVar29->x).n[1];
    if (0x3fffffffffffffff < uVar10) goto LAB_0014969e;
    psVar19 = (secp256k1_modinv64_signed62 *)(psVar29->x).n[2];
    if ((secp256k1_modinv64_signed62 *)0x3fffffffffffffff < psVar19) goto LAB_001496a3;
    uVar11 = (psVar29->x).n[3];
    if (0x3fffffffffffffff < uVar11) goto LAB_001496a8;
    psVar29 = (secp256k1_gej *)(psVar29->x).n[4];
    if (psVar29 < (secp256k1_gej *)0x100) {
      (a_01->x).n[0] = uVar10 << 0x3e | uVar38;
      (a_01->x).n[1] = (long)psVar19 << 0x3c | uVar10 >> 2;
      (a_01->x).n[2] = uVar11 << 0x3a | (ulong)psVar19 >> 4;
      (a_01->x).n[3] = (long)psVar29 << 0x38 | uVar11 >> 6;
      secp256k1_scalar_verify((secp256k1_scalar *)a_01);
      return;
    }
  }
  else {
    psStack_220 = (secp256k1_gej *)0x14969e;
    secp256k1_scalar_from_signed62_cold_5();
LAB_0014969e:
    psStack_220 = (secp256k1_gej *)0x1496a3;
    secp256k1_scalar_from_signed62_cold_4();
LAB_001496a3:
    psStack_220 = (secp256k1_gej *)0x1496a8;
    secp256k1_scalar_from_signed62_cold_3();
LAB_001496a8:
    psStack_220 = (secp256k1_gej *)0x1496ad;
    secp256k1_scalar_from_signed62_cold_2();
  }
  psStack_220 = (secp256k1_gej *)secp256k1_modinv64_update_de_62;
  secp256k1_scalar_from_signed62_cold_1();
  psStack_220 = psVar27;
  lStack_228 = lVar42;
  psStack_230 = psVar33;
  psStack_238 = psVar23;
  psStack_240 = psVar37;
  psStack_248 = psVar26;
  uVar1 = (a_01->x).n[0];
  uStack_268 = (a_01->x).n[1];
  uStack_270 = (a_01->x).n[2];
  uStack_278 = (a_01->x).n[3];
  uStack_288 = (a_01->x).n[4];
  uVar2 = (psVar29->x).n[0];
  psStack_250 = (secp256k1_gej *)(psVar29->x).n[1];
  uVar3 = (psVar29->x).n[2];
  uStack_2b0 = *extraout_RDX;
  psStack_2a8 = (secp256k1_gej *)extraout_RDX[1];
  uStack_2c0 = extraout_RDX[2];
  psStack_2b8 = (secp256k1_gej *)extraout_RDX[3];
  uStack_258 = (psVar29->x).n[3];
  uStack_290 = (psVar29->x).n[4];
  uVar38 = 5;
  psVar37 = (secp256k1_gej *)0xfffffffffffffffe;
  psStack_2c8 = (secp256k1_modinv64_signed62 *)0x149748;
  psVar26 = a_01;
  iVar6 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)a_01,5,psVar19,-2);
  psVar27 = psVar29;
  if (iVar6 < 1) {
LAB_0014a1ed:
    psStack_2c8 = (secp256k1_modinv64_signed62 *)0x14a1f2;
    secp256k1_modinv64_update_de_62_cold_34();
LAB_0014a1f2:
    psStack_2c8 = (secp256k1_modinv64_signed62 *)0x14a1f7;
    secp256k1_modinv64_update_de_62_cold_33();
LAB_0014a1f7:
    psStack_2c8 = (secp256k1_modinv64_signed62 *)0x14a1fc;
    secp256k1_modinv64_update_de_62_cold_32();
LAB_0014a1fc:
    psStack_2c8 = (secp256k1_modinv64_signed62 *)0x14a201;
    secp256k1_modinv64_update_de_62_cold_31();
LAB_0014a201:
    psStack_2c8 = (secp256k1_modinv64_signed62 *)0x14a206;
    secp256k1_modinv64_update_de_62_cold_30();
    psVar43 = psVar19;
LAB_0014a206:
    psStack_2c8 = (secp256k1_modinv64_signed62 *)0x14a20b;
    secp256k1_modinv64_update_de_62_cold_29();
LAB_0014a20b:
    psStack_2c8 = (secp256k1_modinv64_signed62 *)0x14a210;
    secp256k1_modinv64_update_de_62_cold_1();
    psVar19 = psVar43;
LAB_0014a210:
    psStack_2c8 = (secp256k1_modinv64_signed62 *)0x14a215;
    secp256k1_modinv64_update_de_62_cold_2();
LAB_0014a215:
    psStack_2c8 = (secp256k1_modinv64_signed62 *)0x14a21a;
    secp256k1_modinv64_update_de_62_cold_19();
LAB_0014a21a:
    psStack_2c8 = (secp256k1_modinv64_signed62 *)0x14a21f;
    secp256k1_modinv64_update_de_62_cold_17();
LAB_0014a21f:
    psStack_2c8 = (secp256k1_modinv64_signed62 *)0x14a224;
    secp256k1_modinv64_update_de_62_cold_14();
LAB_0014a224:
    psStack_2c8 = (secp256k1_modinv64_signed62 *)0x14a229;
    secp256k1_modinv64_update_de_62_cold_13();
LAB_0014a229:
    psVar23 = psVar26;
    psStack_2c8 = (secp256k1_modinv64_signed62 *)0x14a22e;
    secp256k1_modinv64_update_de_62_cold_12();
LAB_0014a22e:
    psStack_2c8 = (secp256k1_modinv64_signed62 *)0x14a233;
    secp256k1_modinv64_update_de_62_cold_11();
LAB_0014a233:
    psStack_2c8 = (secp256k1_modinv64_signed62 *)0x14a238;
    secp256k1_modinv64_update_de_62_cold_10();
LAB_0014a238:
    psStack_2c8 = (secp256k1_modinv64_signed62 *)0x14a23d;
    secp256k1_modinv64_update_de_62_cold_9();
    psVar26 = psVar23;
LAB_0014a23d:
    psStack_2c8 = (secp256k1_modinv64_signed62 *)0x14a242;
    secp256k1_modinv64_update_de_62_cold_28();
  }
  else {
    psVar37 = (secp256k1_gej *)0x1;
    uVar38 = 5;
    psStack_2c8 = (secp256k1_modinv64_signed62 *)0x14976a;
    psVar26 = a_01;
    psStack_280 = a_01;
    iVar6 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)a_01,5,psVar19,1);
    if (-1 < iVar6) goto LAB_0014a1f2;
    uVar38 = 5;
    psVar37 = (secp256k1_gej *)0xfffffffffffffffe;
    psStack_2c8 = (secp256k1_modinv64_signed62 *)0x149789;
    psVar26 = psVar29;
    iVar6 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)psVar29,5,psVar19,-2);
    if (iVar6 < 1) goto LAB_0014a1f7;
    psVar37 = (secp256k1_gej *)0x1;
    uVar38 = 5;
    psStack_2c8 = (secp256k1_modinv64_signed62 *)0x1497a6;
    psVar26 = psVar29;
    iVar6 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)psVar29,5,psVar19,1);
    if (-1 < iVar6) goto LAB_0014a1fc;
    psVar27 = (secp256k1_gej *)0x3fffffffffffffff;
    psStack_2c8 = (secp256k1_modinv64_signed62 *)0x1497cc;
    psStack_298 = psVar29;
    uStack_260 = uVar3;
    iVar8 = secp256k1_modinv64_abs(uStack_2b0);
    psStack_2c8 = (secp256k1_modinv64_signed62 *)0x1497d9;
    psVar26 = psStack_2a8;
    iVar9 = secp256k1_modinv64_abs((int64_t)psStack_2a8);
    psVar37 = (secp256k1_gej *)(0x4000000000000000 - iVar9);
    if ((long)psVar37 < iVar8) goto LAB_0014a201;
    psStack_2c8 = (secp256k1_modinv64_signed62 *)0x1497f4;
    iVar8 = secp256k1_modinv64_abs(uStack_2c0);
    psStack_2c8 = (secp256k1_modinv64_signed62 *)0x149801;
    psVar26 = psStack_2b8;
    iVar9 = secp256k1_modinv64_abs((int64_t)psStack_2b8);
    psVar37 = (secp256k1_gej *)(0x4000000000000000 - iVar9);
    psVar43 = psVar19;
    if ((long)psVar37 < iVar8) goto LAB_0014a206;
    uVar38 = uStack_2b0 * uVar1;
    psVar37 = SUB168(SEXT816((long)uStack_2b0) * SEXT816((long)uVar1),8);
    uVar10 = (long)psStack_2a8 * uVar2;
    psVar26 = SUB168(SEXT816((long)psStack_2a8) * SEXT816((long)uVar2),8);
    a_01 = (secp256k1_gej *)0x7fffffffffffffff;
    lVar42 = (0x7fffffffffffffff - (long)psVar26) - (long)psVar37;
    if ((SBORROW8(0x7fffffffffffffff - (long)psVar26,(long)psVar37) !=
        SBORROW8(lVar42,(ulong)(~uVar10 < uVar38))) !=
        (long)(lVar42 - (ulong)(~uVar10 < uVar38)) < 0 && -1 < (long)psVar26) goto LAB_0014a23d;
    psVar33 = (secp256k1_gej *)(uVar10 + uVar38);
    psVar26 = (secp256k1_gej *)
              ((long)(psVar37->x).n + (long)(psVar26->x).n + (ulong)CARRY8(uVar10,uVar38));
    uVar11 = uStack_2c0 * uVar1;
    lVar21 = SUB168(SEXT816((long)uStack_2c0) * SEXT816((long)uVar1),8);
    uVar12 = (long)psStack_2b8 * uVar2;
    lVar22 = SUB168(SEXT816((long)psStack_2b8) * SEXT816((long)uVar2),8);
    uVar10 = (ulong)(-uVar12 - 1 < uVar11);
    lVar42 = (0x7fffffffffffffff - lVar22) - lVar21;
    bVar44 = (SBORROW8(0x7fffffffffffffff - lVar22,lVar21) != SBORROW8(lVar42,uVar10)) !=
             (long)(lVar42 - uVar10) < 0;
    psVar37 = (secp256k1_gej *)CONCAT71((int7)(-uVar12 - 1 >> 8),bVar44 && -1 < lVar22);
    if (!bVar44 || -1 >= lVar22) {
      psVar43 = (secp256k1_modinv64_signed62 *)((long)uStack_288 >> 0x3f);
      psVar37 = (secp256k1_gej *)((long)uStack_290 >> 0x3f);
      lVar30 = ((ulong)psStack_2a8 & (ulong)psVar37) + (uStack_2b0 & (ulong)psVar43);
      psVar29 = (secp256k1_gej *)(uVar12 + uVar11);
      lVar21 = lVar22 + lVar21 + (ulong)CARRY8(uVar12,uVar11);
      lVar42 = psVar19->v[0];
      uVar10 = psVar19[1].v[0];
      uVar38 = lVar30 - (uVar10 * (long)psVar33 + lVar30 & 0x3fffffffffffffff);
      puVar13 = (uint64_t *)(uVar38 * lVar42);
      psVar23 = SUB168(SEXT816((long)uVar38) * SEXT816(lVar42),8);
      psStack_2a0 = psVar19;
      if (-1 < (long)psVar23) {
        uVar11 = (ulong)((secp256k1_gej *)(-(long)puVar13 - 1U) < psVar33);
        lVar22 = (0x7fffffffffffffff - (long)psVar23) - (long)psVar26;
        if ((SBORROW8(0x7fffffffffffffff - (long)psVar23,(long)psVar26) != SBORROW8(lVar22,uVar11))
            == (long)(lVar22 - uVar11) < 0) goto LAB_0014992f;
LAB_00149af0:
        psStack_2c8 = (secp256k1_modinv64_signed62 *)0x149af5;
        secp256k1_modinv64_update_de_62_cold_26();
LAB_00149af5:
        lVar30 = (-0x8000000000000000 - lVar42) - (ulong)(uVar10 != 0);
        lVar22 = lVar21 - lVar30;
        if ((SBORROW8(lVar21,lVar30) != SBORROW8(lVar22,(ulong)(psVar29 < (secp256k1_gej *)-uVar10))
            ) == (long)(lVar22 - (ulong)(psVar29 < (secp256k1_gej *)-uVar10)) < 0)
        goto LAB_0014997f;
LAB_00149b17:
        psStack_2c8 = (secp256k1_modinv64_signed62 *)0x149b1c;
        secp256k1_modinv64_update_de_62_cold_25();
        uVar11 = extraout_RAX;
        lVar21 = extraout_RDX_00;
LAB_00149b1c:
        psVar34 = (secp256k1_gej *)((-0x8000000000000000 - lVar21) - (ulong)(uVar11 != 0));
        psVar26 = (secp256k1_gej *)
                  (((long)psVar33 - (long)psVar34) - (ulong)(psVar29 < (secp256k1_gej *)-uVar11));
        if ((SBORROW8((long)psVar33,(long)psVar34) !=
            SBORROW8((long)psVar33 - (long)psVar34,(ulong)(psVar29 < (secp256k1_gej *)-uVar11))) ==
            (long)psVar26 < 0) {
LAB_00149a02:
          uVar10 = uVar10 >> 0x3e | lVar42 << 2;
          bVar44 = CARRY8((ulong)psVar29,uVar11);
          psVar29 = (secp256k1_gej *)((long)(psVar29->x).n + uVar11);
          psVar33 = (secp256k1_gej *)((long)(psVar33->x).n + (ulong)bVar44 + lVar21);
          psVar34 = (secp256k1_gej *)(uStack_2c0 * uStack_268 + uVar10);
          psVar26 = (secp256k1_gej *)
                    (SUB168(SEXT816((long)uStack_2c0) * SEXT816((long)uStack_268),8) +
                     (lVar42 >> 0x3e) + (ulong)CARRY8(uStack_2c0 * uStack_268,uVar10));
          uVar10 = (long)psStack_2b8 * (long)psVar23;
          lVar42 = SUB168(SEXT816((long)psStack_2b8) * SEXT816((long)psVar23),8);
          if (lVar42 < 0) goto LAB_00149b46;
          uVar11 = (ulong)((secp256k1_gej *)(-1 - uVar10) < psVar34);
          lVar21 = (0x7fffffffffffffff - lVar42) - (long)psVar26;
          psVar19 = (secp256k1_modinv64_signed62 *)(lVar21 - uVar11);
          if ((SBORROW8(0x7fffffffffffffff - lVar42,(long)psVar26) != SBORROW8(lVar21,uVar11)) !=
              (long)psVar19 < 0) goto LAB_00149b5e;
        }
        else {
LAB_00149b41:
          psStack_2c8 = (secp256k1_modinv64_signed62 *)0x149b46;
          secp256k1_modinv64_update_de_62_cold_24();
          uVar10 = extraout_RAX_00;
          lVar42 = extraout_RDX_01;
LAB_00149b46:
          psVar19 = (secp256k1_modinv64_signed62 *)
                    ((-0x8000000000000000 - lVar42) - (ulong)(uVar10 != 0));
          if ((SBORROW8((long)psVar26,(long)psVar19) !=
              SBORROW8((long)psVar26 - (long)psVar19,(ulong)(psVar34 < (secp256k1_gej *)-uVar10)))
              != (long)(((long)psVar26 - (long)psVar19) -
                       (ulong)(psVar34 < (secp256k1_gej *)-uVar10)) < 0) {
LAB_00149b5e:
            psStack_2c8 = (secp256k1_modinv64_signed62 *)0x149b63;
            secp256k1_modinv64_update_de_62_cold_23();
            goto LAB_00149b69;
          }
        }
        bVar44 = CARRY8((ulong)psVar34,uVar10);
        psVar34 = (secp256k1_gej *)((long)(psVar34->x).n + uVar10);
        psVar26 = (secp256k1_gej *)((long)(psVar26->x).n + (ulong)bVar44 + lVar42);
        psVar7 = (secp256k1_gej *)psStack_2a0->v[1];
        psVar19 = psStack_2a0;
        if (psVar7 == (secp256k1_gej *)0x0) goto LAB_00149b69;
        psVar32 = (secp256k1_gej *)((long)psVar7 * uVar38);
        psVar24 = SUB168(SEXT816((long)psVar7) * SEXT816((long)uVar38),8);
        if ((long)psVar24 < 0) goto LAB_0014a103;
        uVar10 = (ulong)((secp256k1_gej *)(-(long)psVar32 - 1U) < psVar29);
        lVar42 = (0x7fffffffffffffff - (long)psVar24) - (long)psVar33;
        if ((SBORROW8(0x7fffffffffffffff - (long)psVar24,(long)psVar33) != SBORROW8(lVar42,uVar10))
            != (long)(lVar42 - uVar10) < 0) goto LAB_0014a125;
LAB_00149a9c:
        bVar44 = CARRY8((ulong)psVar32,(ulong)psVar29);
        psVar32 = (secp256k1_gej *)((long)(psVar32->x).n + (long)(psVar29->x).n);
        psVar24 = (secp256k1_gej *)((long)(psVar33->x).n + (long)(psVar24->x).n + (ulong)bVar44);
        uVar10 = (long)psVar7 * (long)psVar37;
        lVar42 = SUB168(SEXT816((long)psVar7) * SEXT816((long)psVar37),8);
        if (lVar42 < 0) goto LAB_0014a12a;
        psVar33 = (secp256k1_gej *)(-1 - uVar10);
        lVar21 = ((long)a_01 - lVar42) - (long)psVar26;
        psVar29 = (secp256k1_gej *)(lVar21 - (ulong)(psVar33 < psVar34));
        if ((SBORROW8((long)a_01 - lVar42,(long)psVar26) !=
            SBORROW8(lVar21,(ulong)(psVar33 < psVar34))) != (long)psVar29 < 0) goto LAB_0014a14c;
LAB_00149acd:
        bVar44 = CARRY8((ulong)psVar34,uVar10);
        psVar34 = (secp256k1_gej *)((long)(psVar34->x).n + uVar10);
        psVar26 = (secp256k1_gej *)((long)(psVar26->x).n + (ulong)bVar44 + lVar42);
        psVar33 = psVar24;
        psVar29 = psVar32;
LAB_00149b69:
        psVar24 = psStack_280;
        uVar10 = (long)psVar33 << 2 | (ulong)psVar29 >> 0x3e;
        psVar23 = (secp256k1_gej *)(uStack_2b0 * uStack_270 + uVar10);
        psVar7 = (secp256k1_gej *)
                 (SUB168(SEXT816((long)uStack_2b0) * SEXT816((long)uStack_270),8) +
                  ((long)psVar33 >> 0x3e) + (ulong)CARRY8(uStack_2b0 * uStack_270,uVar10));
        (psStack_280->x).n[0] = (ulong)psVar29 & 0x3fffffffffffffff;
        uVar10 = (long)psStack_2a8 * uStack_260;
        lVar42 = SUB168(SEXT816((long)psStack_2a8) * SEXT816((long)uStack_260),8);
        (psStack_298->x).n[0] = (ulong)psVar34 & 0x3fffffffffffffff;
        if (lVar42 < 0) {
          psVar29 = (secp256k1_gej *)((-0x8000000000000000 - lVar42) - (ulong)(uVar10 != 0));
          psVar33 = (secp256k1_gej *)
                    (((long)psVar7 - (long)psVar29) - (ulong)(psVar23 < (secp256k1_gej *)-uVar10));
          if ((SBORROW8((long)psVar7,(long)psVar29) !=
              SBORROW8((long)psVar7 - (long)psVar29,(ulong)(psVar23 < (secp256k1_gej *)-uVar10))) !=
              (long)psVar33 < 0) goto LAB_00149cc7;
LAB_00149bd7:
          uVar11 = (ulong)psVar34 >> 0x3e | (long)psVar26 << 2;
          bVar44 = CARRY8((ulong)psVar23,uVar10);
          psVar23 = (secp256k1_gej *)((long)(psVar23->x).n + uVar10);
          psVar7 = (secp256k1_gej *)((long)(psVar7->x).n + (ulong)bVar44 + lVar42);
          psVar29 = (secp256k1_gej *)(uStack_2c0 * uStack_270 + uVar11);
          psVar33 = (secp256k1_gej *)
                    (SUB168(SEXT816((long)uStack_2c0) * SEXT816((long)uStack_270),8) +
                     ((long)psVar26 >> 0x3e) + (ulong)CARRY8(uStack_2c0 * uStack_270,uVar11));
          uVar10 = (long)psStack_2b8 * uStack_260;
          lVar42 = SUB168(SEXT816((long)psStack_2b8) * SEXT816((long)uStack_260),8);
          if (lVar42 < 0) goto LAB_00149ccc;
          uVar11 = (ulong)((secp256k1_gej *)(-1 - uVar10) < psVar29);
          lVar21 = ((long)a_01 - lVar42) - (long)psVar33;
          if ((SBORROW8((long)a_01 - lVar42,(long)psVar33) != SBORROW8(lVar21,uVar11)) !=
              (long)(lVar21 - uVar11) < 0) goto LAB_00149cee;
        }
        else {
          psVar33 = (secp256k1_gej *)(-1 - uVar10);
          lVar21 = ((long)a_01 - lVar42) - (long)psVar7;
          psVar29 = (secp256k1_gej *)(lVar21 - (ulong)(psVar33 < psVar23));
          if ((SBORROW8((long)a_01 - lVar42,(long)psVar7) !=
              SBORROW8(lVar21,(ulong)(psVar33 < psVar23))) == (long)psVar29 < 0) goto LAB_00149bd7;
LAB_00149cc7:
          psStack_2c8 = (secp256k1_modinv64_signed62 *)0x149ccc;
          secp256k1_modinv64_update_de_62_cold_22();
          uVar10 = extraout_RAX_01;
          lVar42 = extraout_RDX_02;
LAB_00149ccc:
          lVar22 = (-0x8000000000000000 - lVar42) - (ulong)(uVar10 != 0);
          lVar21 = (long)psVar33 - lVar22;
          if ((SBORROW8((long)psVar33,lVar22) !=
              SBORROW8(lVar21,(ulong)(psVar29 < (secp256k1_gej *)-uVar10))) !=
              (long)(lVar21 - (ulong)(psVar29 < (secp256k1_gej *)-uVar10)) < 0) {
LAB_00149cee:
            psStack_2c8 = (secp256k1_modinv64_signed62 *)0x149cf3;
            secp256k1_modinv64_update_de_62_cold_21();
            goto LAB_00149cf9;
          }
        }
        bVar44 = CARRY8((ulong)psVar29,uVar10);
        psVar29 = (secp256k1_gej *)((long)(psVar29->x).n + uVar10);
        psVar33 = (secp256k1_gej *)((long)(psVar33->x).n + (ulong)bVar44 + lVar42);
        psVar32 = (secp256k1_gej *)psVar19->v[2];
        if (psVar32 == (secp256k1_gej *)0x0) goto LAB_00149cf9;
        psVar26 = (secp256k1_gej *)((long)psVar32 * uVar38);
        psVar34 = SUB168(SEXT816((long)psVar32) * SEXT816((long)uVar38),8);
        if ((long)psVar34 < 0) goto LAB_0014a151;
        uVar10 = (ulong)((secp256k1_gej *)(-(long)psVar26 - 1U) < psVar23);
        lVar42 = ((long)a_01 - (long)psVar34) - (long)psVar7;
        psVar35 = psVar23;
        if ((SBORROW8((long)a_01 - (long)psVar34,(long)psVar7) != SBORROW8(lVar42,uVar10)) !=
            (long)(lVar42 - uVar10) < 0) goto LAB_0014a173;
LAB_00149c6c:
        bVar44 = CARRY8((ulong)psVar26,(ulong)psVar35);
        psVar26 = (secp256k1_gej *)((long)(psVar26->x).n + (long)(psVar35->x).n);
        psVar34 = (secp256k1_gej *)((long)(psVar7->x).n + (long)(psVar34->x).n + (ulong)bVar44);
        uVar10 = (long)psVar32 * (long)psVar37;
        lVar42 = SUB168(SEXT816((long)psVar32) * SEXT816((long)psVar37),8);
        if (lVar42 < 0) goto LAB_0014a178;
        psVar36 = (secp256k1_gej *)(-1 - uVar10);
        lVar21 = ((long)a_01 - lVar42) - (long)psVar33;
        psVar19 = (secp256k1_modinv64_signed62 *)(lVar21 - (ulong)(psVar36 < psVar29));
        psVar23 = psVar26;
        psVar7 = psVar34;
        if ((SBORROW8((long)a_01 - lVar42,(long)psVar33) !=
            SBORROW8(lVar21,(ulong)(psVar36 < psVar29))) != (long)psVar19 < 0) goto LAB_0014a19a;
LAB_00149c9d:
        bVar44 = CARRY8((ulong)psVar29,uVar10);
        psVar29 = (secp256k1_gej *)((long)(psVar29->x).n + uVar10);
        psVar33 = (secp256k1_gej *)((long)(psVar33->x).n + (ulong)bVar44 + lVar42);
LAB_00149cf9:
        uVar10 = (long)psVar7 << 2 | (ulong)psVar23 >> 0x3e;
        psVar35 = (secp256k1_gej *)(uStack_2b0 * uStack_278 + uVar10);
        psVar36 = (secp256k1_gej *)
                  (SUB168(SEXT816((long)uStack_2b0) * SEXT816((long)uStack_278),8) +
                   ((long)psVar7 >> 0x3e) + (ulong)CARRY8(uStack_2b0 * uStack_278,uVar10));
        (psVar24->x).n[1] = (ulong)psVar23 & 0x3fffffffffffffff;
        uVar10 = (long)psStack_2a8 * uStack_258;
        lVar42 = SUB168(SEXT816((long)psStack_2a8) * SEXT816((long)uStack_258),8);
        (psStack_298->x).n[1] = (ulong)psVar29 & 0x3fffffffffffffff;
        if (lVar42 < 0) {
          uVar11 = (-0x8000000000000000 - lVar42) - (ulong)(uVar10 != 0);
          psVar26 = (secp256k1_gej *)
                    (((long)psVar36 - uVar11) - (ulong)(psVar35 < (secp256k1_gej *)-uVar10));
          if ((SBORROW8((long)psVar36,uVar11) !=
              SBORROW8((long)psVar36 - uVar11,(ulong)(psVar35 < (secp256k1_gej *)-uVar10))) !=
              (long)psVar26 < 0) goto LAB_00149dcf;
LAB_00149d65:
          uVar12 = (ulong)psVar29 >> 0x3e | (long)psVar33 << 2;
          bVar44 = CARRY8((ulong)psVar35,uVar10);
          psVar35 = (secp256k1_gej *)((long)(psVar35->x).n + uVar10);
          psVar36 = (secp256k1_gej *)((long)(psVar36->x).n + (ulong)bVar44 + lVar42);
          uVar11 = uStack_2c0 * uStack_278 + uVar12;
          psVar26 = (secp256k1_gej *)
                    (SUB168(SEXT816((long)uStack_2c0) * SEXT816((long)uStack_278),8) +
                     ((long)psVar33 >> 0x3e) + (ulong)CARRY8(uStack_2c0 * uStack_278,uVar12));
          uVar10 = (long)psStack_2b8 * uStack_258;
          lVar42 = SUB168(SEXT816((long)psStack_2b8) * SEXT816((long)uStack_258),8);
          if (lVar42 < 0) goto LAB_00149dd4;
          uVar12 = (ulong)(-uVar10 - 1 < uVar11);
          lVar21 = ((long)a_01 - lVar42) - (long)psVar26;
          bVar44 = SBORROW8((long)a_01 - lVar42,(long)psVar26) != SBORROW8(lVar21,uVar12);
          lVar21 = lVar21 - uVar12;
        }
        else {
          psVar26 = (secp256k1_gej *)(-1 - uVar10);
          lVar21 = ((long)a_01 - lVar42) - (long)psVar36;
          uVar11 = lVar21 - (ulong)(psVar26 < psVar35);
          if ((SBORROW8((long)a_01 - lVar42,(long)psVar36) !=
              SBORROW8(lVar21,(ulong)(psVar26 < psVar35))) == (long)uVar11 < 0) goto LAB_00149d65;
LAB_00149dcf:
          psStack_2c8 = (secp256k1_modinv64_signed62 *)0x149dd4;
          secp256k1_modinv64_update_de_62_cold_20();
          uVar10 = extraout_RAX_02;
          lVar42 = extraout_RDX_03;
LAB_00149dd4:
          lVar22 = (-0x8000000000000000 - lVar42) - (ulong)(uVar10 != 0);
          lVar21 = (long)psVar26 - lVar22;
          bVar44 = SBORROW8((long)psVar26,lVar22) != SBORROW8(lVar21,(ulong)(uVar11 < -uVar10));
          lVar21 = lVar21 - (ulong)(uVar11 < -uVar10);
        }
        psVar19 = (secp256k1_modinv64_signed62 *)0x8000000000000000;
        if (bVar44 != lVar21 < 0) goto LAB_0014a215;
        psVar34 = (secp256k1_gej *)(uVar11 + uVar10);
        psVar26 = (secp256k1_gej *)((long)(psVar26->x).n + (ulong)CARRY8(uVar11,uVar10) + lVar42);
        psVar33 = (secp256k1_gej *)psStack_2a0->v[3];
        if (psVar33 == (secp256k1_gej *)0x0) goto LAB_00149e73;
        psVar32 = (secp256k1_gej *)((long)psVar33 * uVar38);
        psVar24 = SUB168(SEXT816((long)psVar33) * SEXT816((long)uVar38),8);
        if ((long)psVar24 < 0) goto LAB_0014a19f;
        uVar10 = (ulong)((secp256k1_gej *)(-(long)psVar32 - 1U) < psVar35);
        lVar42 = ((long)a_01 - (long)psVar24) - (long)psVar36;
        if ((SBORROW8((long)a_01 - (long)psVar24,(long)psVar36) != SBORROW8(lVar42,uVar10)) !=
            (long)(lVar42 - uVar10) < 0) goto LAB_0014a1c1;
LAB_00149e34:
        bVar44 = CARRY8((ulong)psVar32,(ulong)psVar35);
        psVar32 = (secp256k1_gej *)((long)(psVar32->x).n + (long)(psVar35->x).n);
        psVar24 = (secp256k1_gej *)((long)(psVar36->x).n + (long)(psVar24->x).n + (ulong)bVar44);
        uVar10 = (long)psVar33 * (long)psVar37;
        lVar42 = SUB168(SEXT816((long)psVar33) * SEXT816((long)psVar37),8);
        if (lVar42 < 0) goto LAB_0014a1c6;
        uVar11 = (ulong)((secp256k1_gej *)(-1 - uVar10) < psVar34);
        lVar21 = ((long)a_01 - lVar42) - (long)psVar26;
        psVar36 = psVar24;
        psVar35 = psVar32;
        if ((SBORROW8((long)a_01 - lVar42,(long)psVar26) != SBORROW8(lVar21,uVar11)) ==
            (long)(lVar21 - uVar11) < 0) {
          do {
            bVar44 = CARRY8((ulong)psVar34,uVar10);
            psVar34 = (secp256k1_gej *)((long)(psVar34->x).n + uVar10);
            psVar26 = (secp256k1_gej *)((long)(psVar26->x).n + (ulong)bVar44 + lVar42);
LAB_00149e73:
            psVar23 = psStack_280;
            uVar10 = (long)psVar36 << 2 | (ulong)psVar35 >> 0x3e;
            psVar35 = (secp256k1_gej *)((ulong)psVar35 & 0x3fffffffffffffff);
            psVar29 = (secp256k1_gej *)(uStack_2b0 * uStack_288 + uVar10);
            psVar33 = (secp256k1_gej *)
                      (SUB168(SEXT816((long)uStack_2b0) * SEXT816((long)uStack_288),8) +
                       ((long)psVar36 >> 0x3e) + (ulong)CARRY8(uStack_2b0 * uStack_288,uVar10));
            (psStack_280->x).n[2] = (uint64_t)psVar35;
            uVar10 = (long)psStack_2a8 * uStack_290;
            lVar42 = SUB168(SEXT816((long)psStack_2a8) * SEXT816((long)uStack_290),8);
            (psStack_298->x).n[2] = (ulong)psVar34 & 0x3fffffffffffffff;
            if (lVar42 < 0) {
              lVar22 = (-0x8000000000000000 - lVar42) - (ulong)(uVar10 != 0);
              lVar21 = (long)psVar33 - lVar22;
              psVar7 = (secp256k1_gej *)(lVar21 - (ulong)(psVar29 < (secp256k1_gej *)-uVar10));
              if ((SBORROW8((long)psVar33,lVar22) !=
                  SBORROW8(lVar21,(ulong)(psVar29 < (secp256k1_gej *)-uVar10))) != (long)psVar7 < 0)
              goto LAB_00149f4d;
LAB_00149ee1:
              uVar11 = (ulong)psVar34 >> 0x3e | (long)psVar26 << 2;
              bVar44 = CARRY8((ulong)psVar29,uVar10);
              psVar29 = (secp256k1_gej *)((long)(psVar29->x).n + uVar10);
              psVar33 = (secp256k1_gej *)((long)(psVar33->x).n + (ulong)bVar44 + lVar42);
              psVar35 = (secp256k1_gej *)(uStack_2c0 * uStack_288 + uVar11);
              psVar7 = (secp256k1_gej *)
                       (SUB168(SEXT816((long)uStack_2c0) * SEXT816((long)uStack_288),8) +
                        ((long)psVar26 >> 0x3e) + (ulong)CARRY8(uStack_2c0 * uStack_288,uVar11));
              uVar10 = (long)psStack_2b8 * uStack_290;
              lVar42 = SUB168(SEXT816((long)psStack_2b8) * SEXT816((long)uStack_290),8);
              if (lVar42 < 0) goto LAB_00149f52;
              psVar26 = (secp256k1_gej *)(-1 - uVar10);
              lVar21 = ((long)a_01 - lVar42) - (long)psVar7;
              bVar44 = SBORROW8((long)a_01 - lVar42,(long)psVar7) !=
                       SBORROW8(lVar21,(ulong)(psVar26 < psVar35));
              psVar34 = (secp256k1_gej *)(lVar21 - (ulong)(psVar26 < psVar35));
            }
            else {
              psVar7 = (secp256k1_gej *)(-1 - uVar10);
              lVar21 = ((long)a_01 - lVar42) - (long)psVar33;
              if ((SBORROW8((long)a_01 - lVar42,(long)psVar33) !=
                  SBORROW8(lVar21,(ulong)(psVar7 < psVar29))) ==
                  (long)(lVar21 - (ulong)(psVar7 < psVar29)) < 0) goto LAB_00149ee1;
LAB_00149f4d:
              psStack_2c8 = (secp256k1_modinv64_signed62 *)0x149f52;
              secp256k1_modinv64_update_de_62_cold_18();
              uVar10 = extraout_RAX_03;
              lVar42 = extraout_RDX_04;
LAB_00149f52:
              lVar22 = (-0x8000000000000000 - lVar42) - (ulong)(uVar10 != 0);
              lVar21 = (long)psVar7 - lVar22;
              bVar44 = SBORROW8((long)psVar7,lVar22) !=
                       SBORROW8(lVar21,(ulong)(psVar35 < (secp256k1_gej *)-uVar10));
              psVar26 = (secp256k1_gej *)(lVar21 - (ulong)(psVar35 < (secp256k1_gej *)-uVar10));
              psVar34 = psVar26;
            }
            psVar19 = psStack_2a0;
            psVar24 = (secp256k1_gej *)0x8000000000000000;
            if (bVar44 != (long)psVar34 < 0) goto LAB_0014a21a;
            psVar32 = (secp256k1_gej *)((long)(psVar35->x).n + uVar10);
            psVar7 = (secp256k1_gej *)
                     ((long)(psVar7->x).n + (ulong)CARRY8((ulong)psVar35,uVar10) + lVar42);
            psVar34 = (secp256k1_gej *)psStack_2a0->v[4];
            psVar26 = (secp256k1_gej *)((long)psVar34 * uVar38);
            uVar38 = SUB168(SEXT816((long)psVar34) * SEXT816((long)uVar38),8);
            if ((long)uVar38 < 0) {
              lVar21 = (-0x8000000000000000 - uVar38) - (ulong)(psVar26 != (secp256k1_gej *)0x0);
              lVar42 = (long)psVar33 - lVar21;
              if ((SBORROW8((long)psVar33,lVar21) !=
                  SBORROW8(lVar42,(ulong)(psVar29 < (secp256k1_gej *)-(long)psVar26))) !=
                  (long)(lVar42 - (ulong)(psVar29 < (secp256k1_gej *)-(long)psVar26)) < 0)
              goto LAB_0014a0de;
LAB_00149fad:
              bVar44 = CARRY8((ulong)psVar26,(ulong)psVar29);
              psVar26 = (secp256k1_gej *)((long)(psVar26->x).n + (long)(psVar29->x).n);
              uVar38 = (long)(psVar33->x).n + bVar44 + uVar38;
              uVar10 = (long)psVar34 * (long)psVar37;
              lVar42 = SUB168(SEXT816((long)psVar34) * SEXT816((long)psVar37),8);
              if (lVar42 < 0) goto LAB_0014a0e3;
              psVar37 = (secp256k1_gej *)(-uVar10 - 1);
              lVar21 = (long)a_01 - lVar42;
              lVar22 = lVar21 - (long)psVar7;
              a_01 = (secp256k1_gej *)(lVar22 - (ulong)(psVar37 < psVar32));
              if ((SBORROW8(lVar21,(long)psVar7) != SBORROW8(lVar22,(ulong)(psVar37 < psVar32))) ==
                  (long)a_01 < 0) goto LAB_00149fdb;
            }
            else {
              uVar10 = (ulong)((secp256k1_gej *)(-(long)psVar26 - 1U) < psVar29);
              lVar42 = ((long)a_01 - uVar38) - (long)psVar33;
              if ((SBORROW8((long)a_01 - uVar38,(long)psVar33) != SBORROW8(lVar42,uVar10)) ==
                  (long)(lVar42 - uVar10) < 0) goto LAB_00149fad;
LAB_0014a0de:
              psStack_2c8 = (secp256k1_modinv64_signed62 *)0x14a0e3;
              secp256k1_modinv64_update_de_62_cold_16();
              uVar10 = extraout_RAX_04;
              lVar42 = extraout_RDX_05;
LAB_0014a0e3:
              psVar33 = (secp256k1_gej *)((-0x8000000000000000 - lVar42) - (ulong)(uVar10 != 0));
              psVar37 = (secp256k1_gej *)
                        (((long)psVar7 - (long)psVar33) -
                        (ulong)(psVar32 < (secp256k1_gej *)-uVar10));
              if ((SBORROW8((long)psVar7,(long)psVar33) !=
                  SBORROW8((long)psVar7 - (long)psVar33,(ulong)(psVar32 < (secp256k1_gej *)-uVar10))
                  ) == (long)psVar37 < 0) {
LAB_00149fdb:
                a_01 = psStack_298;
                uVar11 = (long)(psVar32->x).n + uVar10;
                lVar42 = (long)(psVar7->x).n + (ulong)CARRY8(uVar10,(ulong)psVar32) + lVar42;
                psVar37 = (secp256k1_gej *)(uVar38 << 2 | (ulong)psVar26 >> 0x3e);
                (psVar23->x).n[3] = (ulong)psVar26 & 0x3fffffffffffffff;
                psVar27 = (secp256k1_gej *)(uVar11 & 0x3fffffffffffffff);
                (psStack_298->x).n[3] = (uint64_t)psVar27;
                psVar26 = (secp256k1_gej *)&psVar37[0xd79435e50d7942].z;
                uVar38 = ((long)uVar38 >> 0x3e) + -1 +
                         (ulong)((secp256k1_gej *)0x7fffffffffffffff < psVar37);
                if (uVar38 != 0xffffffffffffffff) goto LAB_0014a21f;
                uVar38 = 0xffffffffffffffff;
                uVar10 = uVar11 >> 0x3e | lVar42 * 4;
                (psVar23->x).n[4] = (uint64_t)psVar37;
                if ((lVar42 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar10) != -1)
                goto LAB_0014a224;
                (psStack_298->x).n[4] = uVar10;
                uVar38 = 5;
                psVar37 = (secp256k1_gej *)0xfffffffffffffffe;
                psStack_2c8 = (secp256k1_modinv64_signed62 *)0x14a053;
                psVar26 = psVar23;
                iVar6 = secp256k1_modinv64_mul_cmp_62
                                  ((secp256k1_modinv64_signed62 *)psVar23,5,psVar19,-2);
                if (iVar6 < 1) goto LAB_0014a229;
                psVar37 = (secp256k1_gej *)0x1;
                uVar38 = 5;
                psStack_2c8 = (secp256k1_modinv64_signed62 *)0x14a070;
                iVar6 = secp256k1_modinv64_mul_cmp_62
                                  ((secp256k1_modinv64_signed62 *)psVar23,5,psVar19,1);
                if (-1 < iVar6) goto LAB_0014a22e;
                uVar38 = 5;
                psVar37 = (secp256k1_gej *)0xfffffffffffffffe;
                psStack_2c8 = (secp256k1_modinv64_signed62 *)0x14a08f;
                psVar23 = a_01;
                iVar6 = secp256k1_modinv64_mul_cmp_62
                                  ((secp256k1_modinv64_signed62 *)a_01,5,psVar19,-2);
                if (iVar6 < 1) goto LAB_0014a233;
                psVar37 = (secp256k1_gej *)0x1;
                uVar38 = 5;
                psStack_2c8 = (secp256k1_modinv64_signed62 *)0x14a0ac;
                psVar23 = a_01;
                iVar6 = secp256k1_modinv64_mul_cmp_62
                                  ((secp256k1_modinv64_signed62 *)a_01,5,psVar19,1);
                if (iVar6 < 0) {
                  return;
                }
                goto LAB_0014a238;
              }
            }
            psStack_2c8 = (secp256k1_modinv64_signed62 *)0x14a103;
            secp256k1_modinv64_update_de_62_cold_15();
LAB_0014a103:
            lVar21 = (-0x8000000000000000 - (long)psVar24) -
                     (ulong)(psVar32 != (secp256k1_gej *)0x0);
            lVar42 = (long)psVar33 - lVar21;
            if ((SBORROW8((long)psVar33,lVar21) !=
                SBORROW8(lVar42,(ulong)(psVar29 < (secp256k1_gej *)-(long)psVar32))) ==
                (long)(lVar42 - (ulong)(psVar29 < (secp256k1_gej *)-(long)psVar32)) < 0)
            goto LAB_00149a9c;
LAB_0014a125:
            psStack_2c8 = (secp256k1_modinv64_signed62 *)0x14a12a;
            secp256k1_modinv64_update_de_62_cold_4();
            uVar10 = extraout_RAX_05;
            lVar42 = extraout_RDX_06;
LAB_0014a12a:
            psVar29 = (secp256k1_gej *)((-0x8000000000000000 - lVar42) - (ulong)(uVar10 != 0));
            psVar33 = (secp256k1_gej *)
                      (((long)psVar26 - (long)psVar29) - (ulong)(psVar34 < (secp256k1_gej *)-uVar10)
                      );
            if ((SBORROW8((long)psVar26,(long)psVar29) !=
                SBORROW8((long)psVar26 - (long)psVar29,(ulong)(psVar34 < (secp256k1_gej *)-uVar10)))
                == (long)psVar33 < 0) goto LAB_00149acd;
LAB_0014a14c:
            psStack_2c8 = (secp256k1_modinv64_signed62 *)0x14a151;
            secp256k1_modinv64_update_de_62_cold_3();
LAB_0014a151:
            lVar21 = (-0x8000000000000000 - (long)psVar34) -
                     (ulong)(psVar26 != (secp256k1_gej *)0x0);
            lVar42 = (long)psVar7 - lVar21;
            psVar35 = psVar23;
            if ((SBORROW8((long)psVar7,lVar21) !=
                SBORROW8(lVar42,(ulong)(psVar23 < (secp256k1_gej *)-(long)psVar26))) ==
                (long)(lVar42 - (ulong)(psVar23 < (secp256k1_gej *)-(long)psVar26)) < 0)
            goto LAB_00149c6c;
LAB_0014a173:
            psStack_2c8 = (secp256k1_modinv64_signed62 *)0x14a178;
            secp256k1_modinv64_update_de_62_cold_6();
            uVar10 = extraout_RAX_06;
            lVar42 = extraout_RDX_07;
            psVar35 = psVar23;
LAB_0014a178:
            psVar19 = (secp256k1_modinv64_signed62 *)
                      ((-0x8000000000000000 - lVar42) - (ulong)(uVar10 != 0));
            psVar36 = (secp256k1_gej *)
                      (((long)psVar33 - (long)psVar19) - (ulong)(psVar29 < (secp256k1_gej *)-uVar10)
                      );
            psVar23 = psVar26;
            psVar7 = psVar34;
            if ((SBORROW8((long)psVar33,(long)psVar19) !=
                SBORROW8((long)psVar33 - (long)psVar19,(ulong)(psVar29 < (secp256k1_gej *)-uVar10)))
                == (long)psVar36 < 0) goto LAB_00149c9d;
LAB_0014a19a:
            psStack_2c8 = (secp256k1_modinv64_signed62 *)0x14a19f;
            secp256k1_modinv64_update_de_62_cold_5();
LAB_0014a19f:
            lVar21 = (-0x8000000000000000 - (long)psVar24) -
                     (ulong)(psVar32 != (secp256k1_gej *)0x0);
            lVar42 = (long)psVar36 - lVar21;
            if ((SBORROW8((long)psVar36,lVar21) !=
                SBORROW8(lVar42,(ulong)(psVar35 < (secp256k1_gej *)-(long)psVar32))) ==
                (long)(lVar42 - (ulong)(psVar35 < (secp256k1_gej *)-(long)psVar32)) < 0)
            goto LAB_00149e34;
LAB_0014a1c1:
            psStack_2c8 = (secp256k1_modinv64_signed62 *)0x14a1c6;
            secp256k1_modinv64_update_de_62_cold_8();
            uVar10 = extraout_RAX_07;
            lVar42 = extraout_RDX_08;
LAB_0014a1c6:
            lVar22 = (-0x8000000000000000 - lVar42) - (ulong)(uVar10 != 0);
            lVar21 = (long)psVar26 - lVar22;
            psVar36 = psVar24;
            psVar35 = psVar32;
            if ((SBORROW8((long)psVar26,lVar22) !=
                SBORROW8(lVar21,(ulong)(psVar34 < (secp256k1_gej *)-uVar10))) !=
                (long)(lVar21 - (ulong)(psVar34 < (secp256k1_gej *)-uVar10)) < 0) break;
          } while( true );
        }
        psStack_2c8 = (secp256k1_modinv64_signed62 *)0x14a1ed;
        secp256k1_modinv64_update_de_62_cold_7();
        goto LAB_0014a1ed;
      }
      lVar30 = (-0x8000000000000000 - (long)psVar23) - (ulong)(puVar13 != (uint64_t *)0x0);
      lVar22 = (long)psVar26 - lVar30;
      if ((SBORROW8((long)psVar26,lVar30) !=
          SBORROW8(lVar22,(ulong)(psVar33 < (secp256k1_gej *)-(long)puVar13))) !=
          (long)(lVar22 - (ulong)(psVar33 < (secp256k1_gej *)-(long)puVar13)) < 0)
      goto LAB_00149af0;
LAB_0014992f:
      psVar43 = (secp256k1_modinv64_signed62 *)((ulong)psVar43 & uStack_2c0);
      psVar37 = (secp256k1_gej *)
                ((long)psVar43 +
                (((ulong)psVar37 & (ulong)psStack_2b8) -
                ((long)psVar43->v + uVar10 * (long)psVar29 + ((ulong)psVar37 & (ulong)psStack_2b8) &
                0x3fffffffffffffff)));
      bVar44 = CARRY8((ulong)puVar13,(ulong)psVar33);
      puVar13 = (uint64_t *)((long)(psVar33->x).n + (long)puVar13);
      psVar23 = (secp256k1_gej *)((long)(psVar26->x).n + (long)(psVar23->x).n + (ulong)bVar44);
      uVar10 = (long)psVar37 * lVar42;
      lVar42 = SUB168(SEXT816((long)psVar37) * SEXT816(lVar42),8);
      if (lVar42 < 0) goto LAB_00149af5;
      uVar11 = (ulong)((secp256k1_gej *)(-uVar10 - 1) < psVar29);
      lVar22 = (0x7fffffffffffffff - lVar42) - lVar21;
      if ((SBORROW8(0x7fffffffffffffff - lVar42,lVar21) != SBORROW8(lVar22,uVar11)) !=
          (long)(lVar22 - uVar11) < 0) goto LAB_00149b17;
LAB_0014997f:
      bVar44 = CARRY8(uVar10,(ulong)psVar29);
      uVar10 = (long)(psVar29->x).n + uVar10;
      lVar42 = lVar42 + lVar21 + (ulong)bVar44;
      if (((ulong)puVar13 & 0x3fffffffffffffff) != 0) goto LAB_0014a20b;
      psVar19 = psVar43;
      if ((uVar10 & 0x3fffffffffffffff) == 0) {
        uVar11 = (ulong)puVar13 >> 0x3e | (long)psVar23 << 2;
        psVar29 = (secp256k1_gej *)(uStack_2b0 * uStack_268 + uVar11);
        psVar33 = (secp256k1_gej *)
                  (SUB168(SEXT816((long)uStack_2b0) * SEXT816((long)uStack_268),8) +
                   ((long)psVar23 >> 0x3e) + (ulong)CARRY8(uStack_2b0 * uStack_268,uVar11));
        uVar11 = (long)psStack_2a8 * (long)psStack_250;
        lVar21 = SUB168(SEXT816((long)psStack_2a8) * SEXT816((long)psStack_250),8);
        psVar23 = psStack_250;
        if (lVar21 < 0) goto LAB_00149b1c;
        psVar26 = (secp256k1_gej *)(-1 - uVar11);
        lVar22 = (0x7fffffffffffffff - lVar21) - (long)psVar33;
        psVar34 = (secp256k1_gej *)(lVar22 - (ulong)(psVar26 < psVar29));
        if ((SBORROW8(0x7fffffffffffffff - lVar21,(long)psVar33) !=
            SBORROW8(lVar22,(ulong)(psVar26 < psVar29))) != (long)psVar34 < 0) goto LAB_00149b41;
        goto LAB_00149a02;
      }
      goto LAB_0014a210;
    }
  }
  iVar6 = (int)uVar38;
  psStack_2c8 = (secp256k1_modinv64_signed62 *)secp256k1_modinv64_mul_cmp_62;
  secp256k1_modinv64_update_de_62_cold_27();
  psVar43 = &sStack_328;
  psStack_2d8 = psVar27;
  psStack_2d0 = a_01;
  psStack_2c8 = psVar19;
  secp256k1_modinv64_mul_62(&sStack_300,(secp256k1_modinv64_signed62 *)psVar26,iVar6,1);
  psVar19 = a;
  secp256k1_modinv64_mul_62(&sStack_328,a,5,(int64_t)psVar37);
  lVar42 = 0;
  while ((ulong)sStack_300.v[lVar42] < 0x4000000000000000) {
    if (0x3fffffffffffffff < (ulong)sStack_328.v[lVar42]) goto LAB_0014a2d7;
    lVar42 = lVar42 + 1;
    if (lVar42 == 4) {
      uVar28 = 4;
      while( true ) {
        if (sStack_300.v[uVar28] < sStack_328.v[uVar28]) {
          return;
        }
        if (sStack_328.v[uVar28] < sStack_300.v[uVar28]) break;
        bVar44 = uVar28 == 0;
        uVar28 = uVar28 - 1;
        if (bVar44) {
          return;
        }
      }
      return;
    }
  }
  secp256k1_modinv64_mul_cmp_62_cold_2();
LAB_0014a2d7:
  secp256k1_modinv64_mul_cmp_62_cold_1();
  iVar6 = (int)psVar43;
  if (iVar6 < 1) {
LAB_0014a584:
    secp256k1_modinv64_update_fg_62_var_cold_9();
LAB_0014a589:
    secp256k1_modinv64_update_fg_62_var_cold_1();
LAB_0014a58e:
    secp256k1_modinv64_update_fg_62_var_cold_2();
LAB_0014a593:
    secp256k1_modinv64_update_fg_62_var_cold_6();
LAB_0014a598:
    secp256k1_modinv64_update_fg_62_var_cold_5();
LAB_0014a59d:
    secp256k1_modinv64_update_fg_62_var_cold_8();
  }
  else {
    uVar1 = (psVar37->x).n[0];
    uVar2 = (psVar37->x).n[1];
    lVar42 = psVar19->v[0];
    lVar21 = *extraout_RDX_09;
    uVar38 = lVar42 * uVar1;
    lVar30 = SUB168(SEXT816(lVar42) * SEXT816((long)uVar1),8);
    uVar10 = lVar21 * uVar2;
    lVar25 = SUB168(SEXT816(lVar21) * SEXT816((long)uVar2),8);
    lVar22 = (0x7fffffffffffffff - lVar25) - lVar30;
    if ((SBORROW8(0x7fffffffffffffff - lVar25,lVar30) != SBORROW8(lVar22,(ulong)(~uVar10 < uVar38)))
        != (long)(lVar22 - (ulong)(~uVar10 < uVar38)) < 0 && -1 < lVar25) goto LAB_0014a59d;
    uVar3 = (psVar37->x).n[2];
    uVar4 = (psVar37->x).n[3];
    lVar30 = lVar25 + lVar30 + (ulong)CARRY8(uVar10,uVar38);
    uVar12 = lVar42 * uVar3;
    lVar22 = SUB168(SEXT816(lVar42) * SEXT816((long)uVar3),8);
    uVar41 = lVar21 * uVar4;
    lVar21 = SUB168(SEXT816(lVar21) * SEXT816((long)uVar4),8);
    uVar11 = (ulong)(-uVar41 - 1 < uVar12);
    lVar42 = (0x7fffffffffffffff - lVar21) - lVar22;
    if ((SBORROW8(0x7fffffffffffffff - lVar21,lVar22) != SBORROW8(lVar42,uVar11)) ==
        (long)(lVar42 - uVar11) < 0 || lVar21 < 0) {
      lVar42 = lVar21 + lVar22 + (ulong)CARRY8(uVar41,uVar12);
      if ((uVar10 + uVar38 & 0x3fffffffffffffff) != 0) goto LAB_0014a589;
      if ((uVar41 + uVar12 & 0x3fffffffffffffff) != 0) goto LAB_0014a58e;
      uVar11 = uVar41 + uVar12 >> 0x3e | lVar42 * 4;
      uVar38 = uVar10 + uVar38 >> 0x3e | lVar30 * 4;
      lVar42 = lVar42 >> 0x3e;
      lVar30 = lVar30 >> 0x3e;
      if (iVar6 != 1) {
        psVar43 = (secp256k1_modinv64_signed62 *)((ulong)psVar43 & 0xffffffff);
        psVar20 = (secp256k1_modinv64_signed62 *)0x1;
        do {
          lVar21 = psVar19->v[(long)psVar20];
          uVar12 = lVar21 * uVar1 + uVar38;
          lVar25 = SUB168(SEXT816(lVar21) * SEXT816((long)uVar1),8) + lVar30 +
                   (ulong)CARRY8(lVar21 * uVar1,uVar38);
          lVar22 = extraout_RDX_09[(long)psVar20];
          uVar10 = lVar22 * uVar2;
          lVar30 = SUB168(SEXT816(lVar22) * SEXT816((long)uVar2),8);
          if (lVar30 < 0) {
            lVar39 = (-0x8000000000000000 - lVar30) - (ulong)(uVar10 != 0);
            lVar14 = lVar25 - lVar39;
            if ((SBORROW8(lVar25,lVar39) != SBORROW8(lVar14,(ulong)(uVar12 < -uVar10))) ==
                (long)(lVar14 - (ulong)(uVar12 < -uVar10)) < 0) goto LAB_0014a473;
LAB_0014a57a:
            secp256k1_modinv64_update_fg_62_var_cold_4();
LAB_0014a57f:
            secp256k1_modinv64_update_fg_62_var_cold_3();
            goto LAB_0014a584;
          }
          uVar38 = (ulong)(-uVar10 - 1 < uVar12);
          lVar14 = (0x7fffffffffffffff - lVar30) - lVar25;
          if ((SBORROW8(0x7fffffffffffffff - lVar30,lVar25) != SBORROW8(lVar14,uVar38)) !=
              (long)(lVar14 - uVar38) < 0) goto LAB_0014a57a;
LAB_0014a473:
          lVar30 = lVar25 + lVar30 + (ulong)CARRY8(uVar12,uVar10);
          uVar40 = lVar21 * uVar3 + uVar11;
          lVar21 = SUB168(SEXT816(lVar21) * SEXT816((long)uVar3),8) + lVar42 +
                   (ulong)CARRY8(lVar21 * uVar3,uVar11);
          uVar41 = lVar22 * uVar4;
          lVar42 = SUB168(SEXT816(lVar22) * SEXT816((long)uVar4),8);
          if (lVar42 < 0) {
            lVar25 = (-0x8000000000000000 - lVar42) - (ulong)(uVar41 != 0);
            lVar22 = lVar21 - lVar25;
            if ((SBORROW8(lVar21,lVar25) != SBORROW8(lVar22,(ulong)(uVar40 < -uVar41))) !=
                (long)(lVar22 - (ulong)(uVar40 < -uVar41)) < 0) goto LAB_0014a57f;
          }
          else {
            uVar38 = (ulong)(-uVar41 - 1 < uVar40);
            lVar22 = (0x7fffffffffffffff - lVar42) - lVar21;
            if ((SBORROW8(0x7fffffffffffffff - lVar42,lVar21) != SBORROW8(lVar22,uVar38)) !=
                (long)(lVar22 - uVar38) < 0) goto LAB_0014a57f;
          }
          lVar42 = lVar21 + lVar42 + (ulong)CARRY8(uVar40,uVar41);
          uVar38 = lVar30 * 4 | uVar12 + uVar10 >> 0x3e;
          psVar19->v[(long)((long)psVar20[-1].v + 0x27)] = uVar12 + uVar10 & 0x3fffffffffffffff;
          uVar11 = lVar42 * 4 | uVar40 + uVar41 >> 0x3e;
          extraout_RDX_09[(long)((long)psVar20[-1].v + 0x27)] = uVar40 + uVar41 & 0x3fffffffffffffff
          ;
          psVar20 = (secp256k1_modinv64_signed62 *)((long)psVar20->v + 1);
          lVar42 = lVar42 >> 0x3e;
          lVar30 = lVar30 >> 0x3e;
        } while (psVar43 != psVar20);
      }
      if (lVar30 + -1 + (ulong)(0x7fffffffffffffff < uVar38) != -1) goto LAB_0014a593;
      psVar19->v[(long)iVar6 + -1] = uVar38;
      if (lVar42 + -1 + (ulong)(0x7fffffffffffffff < uVar11) == -1) {
        extraout_RDX_09[(long)iVar6 + -1] = uVar11;
        return;
      }
      goto LAB_0014a598;
    }
  }
  secp256k1_modinv64_update_fg_62_var_cold_7();
  lVar42 = psVar43->v[0];
  lVar21 = psVar43->v[1];
  lVar22 = psVar43->v[2];
  lVar30 = psVar43->v[3];
  lVar25 = psVar43->v[4];
  lVar14 = 0;
  do {
    if (psVar43->v[lVar14] < -0x3fffffffffffffff) {
      secp256k1_modinv64_normalize_62_cold_7();
LAB_0014a7d3:
      secp256k1_modinv64_normalize_62_cold_6();
      goto LAB_0014a7d8;
    }
    if (0x3fffffffffffffff < psVar43->v[lVar14]) goto LAB_0014a7d3;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 5);
  iVar6 = secp256k1_modinv64_mul_cmp_62(psVar43,5,b,-2);
  if (iVar6 < 1) {
LAB_0014a7d8:
    secp256k1_modinv64_normalize_62_cold_5();
LAB_0014a7dd:
    secp256k1_modinv64_normalize_62_cold_4();
LAB_0014a7e2:
    secp256k1_modinv64_normalize_62_cold_3();
  }
  else {
    iVar6 = secp256k1_modinv64_mul_cmp_62(psVar43,5,b,1);
    if (-1 < iVar6) goto LAB_0014a7dd;
    uVar38 = lVar25 >> 0x3f;
    uVar12 = (long)psVar19 >> 0x3f;
    uVar10 = ((uVar38 & b->v[0]) + lVar42 ^ uVar12) - uVar12;
    uVar41 = ((long)uVar10 >> 0x3e) + (((uVar38 & b->v[1]) + lVar21 ^ uVar12) - uVar12);
    uVar40 = ((long)uVar41 >> 0x3e) + ((lVar22 + (uVar38 & b->v[2]) ^ uVar12) - uVar12);
    uVar11 = ((long)uVar40 >> 0x3e) + (((uVar38 & b->v[3]) + lVar30 ^ uVar12) - uVar12);
    lVar42 = ((long)uVar11 >> 0x3e) + (((uVar38 & b->v[4]) + lVar25 ^ uVar12) - uVar12);
    uVar12 = lVar42 >> 0x3f;
    uVar38 = (b->v[0] & uVar12) + (uVar10 & 0x3fffffffffffffff);
    uVar41 = ((long)uVar38 >> 0x3e) + (b->v[1] & uVar12) + (uVar41 & 0x3fffffffffffffff);
    uVar10 = ((long)uVar41 >> 0x3e) + (b->v[2] & uVar12) + (uVar40 & 0x3fffffffffffffff);
    uVar11 = ((long)uVar10 >> 0x3e) + (b->v[3] & uVar12) + (uVar11 & 0x3fffffffffffffff);
    uVar12 = (b->v[4] & uVar12) + lVar42 + ((long)uVar11 >> 0x3e);
    psVar43->v[0] = uVar38 & 0x3fffffffffffffff;
    psVar43->v[1] = uVar41 & 0x3fffffffffffffff;
    psVar43->v[2] = uVar10 & 0x3fffffffffffffff;
    psVar43->v[3] = uVar11 & 0x3fffffffffffffff;
    psVar43->v[4] = uVar12;
    if (0x3fffffffffffffff < uVar12) goto LAB_0014a7e2;
    iVar6 = secp256k1_modinv64_mul_cmp_62(psVar43,5,b,0);
    if (-1 < iVar6) {
      iVar6 = secp256k1_modinv64_mul_cmp_62(psVar43,5,b,1);
      if (iVar6 < 0) {
        return;
      }
      goto LAB_0014a7ec;
    }
  }
  secp256k1_modinv64_normalize_62_cold_2();
LAB_0014a7ec:
  secp256k1_modinv64_normalize_62_cold_1();
  return;
}

Assistant:

SECP256K1_INLINE static int secp256k1_scalar_check_overflow(const secp256k1_scalar *a) {
    int yes = 0;
    int no = 0;
    no |= (a->d[3] < SECP256K1_N_3); /* No need for a > check. */
    no |= (a->d[2] < SECP256K1_N_2);
    yes |= (a->d[2] > SECP256K1_N_2) & ~no;
    no |= (a->d[1] < SECP256K1_N_1);
    yes |= (a->d[1] > SECP256K1_N_1) & ~no;
    yes |= (a->d[0] >= SECP256K1_N_0) & ~no;
    return yes;
}